

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdecode.cpp
# Opt level: O3

bdecode_node * __thiscall libtorrent::bdecode_node::operator=(bdecode_node *this,bdecode_node *n)

{
  pointer pbVar1;
  char *pcVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  
  if (n != this) {
    ::std::vector<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>::
    operator=(&this->m_tokens,&n->m_tokens);
    pcVar2 = n->m_buffer;
    this->m_root_tokens = n->m_root_tokens;
    this->m_buffer = pcVar2;
    iVar3 = n->m_token_idx;
    iVar4 = n->m_last_index;
    iVar5 = n->m_last_token;
    this->m_buffer_size = n->m_buffer_size;
    this->m_token_idx = iVar3;
    this->m_last_index = iVar4;
    this->m_last_token = iVar5;
    this->m_size = n->m_size;
    pbVar1 = (this->m_tokens).
             super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (pbVar1 != (this->m_tokens).
                  super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      this->m_root_tokens = pbVar1;
    }
  }
  return this;
}

Assistant:

bdecode_node& bdecode_node::operator=(bdecode_node const& n) &
	{
		if (&n == this) return *this;
		m_tokens = n.m_tokens;
		m_root_tokens = n.m_root_tokens;
		m_buffer = n.m_buffer;
		m_buffer_size = n.m_buffer_size;
		m_token_idx = n.m_token_idx;
		m_last_index = n.m_last_index;
		m_last_token = n.m_last_token;
		m_size = n.m_size;
		if (!m_tokens.empty())
		{
			// if this is a root, make the token pointer
			// point to our storage
			m_root_tokens = &m_tokens[0];
		}
		return *this;
	}